

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall
pbrt::ImageAndMetadata::ImageAndMetadata(ImageAndMetadata *this,ImageAndMetadata *param_1)

{
  bool bVar1;
  size_t sVar2;
  memory_resource *pmVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (param_1->image).resolution.super_Tuple2<pbrt::Point2,_int>.y;
  iVar11 = (param_1->image).resolution.super_Tuple2<pbrt::Point2,_int>.x;
  (this->image).format = (param_1->image).format;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar11;
  (this->image).channelNames.alloc.memoryResource =
       (param_1->image).channelNames.alloc.memoryResource;
  (this->image).channelNames.nStored = 0;
  (this->image).channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->image).channelNames.nAlloc = 0;
  sVar2 = (param_1->image).channelNames.nStored;
  (this->image).channelNames.nAlloc = (param_1->image).channelNames.nAlloc;
  (this->image).channelNames.nStored = sVar2;
  (this->image).channelNames.ptr = (param_1->image).channelNames.ptr;
  (param_1->image).channelNames.nStored = 0;
  (param_1->image).channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (param_1->image).channelNames.nAlloc = 0;
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  pmVar3 = (param_1->image).p8.alloc.memoryResource;
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (param_1->image).encoding.
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
  (this->image).p8.alloc.memoryResource = pmVar3;
  (this->image).p8.ptr = (uchar *)0x0;
  (this->image).p8.nAlloc = 0;
  (this->image).p8.nStored = 0;
  sVar2 = (param_1->image).p8.nStored;
  (this->image).p8.nAlloc = (param_1->image).p8.nAlloc;
  (this->image).p8.nStored = sVar2;
  (this->image).p8.ptr = (param_1->image).p8.ptr;
  (param_1->image).p8.nStored = 0;
  (param_1->image).p8.ptr = (uchar *)0x0;
  (param_1->image).p8.nAlloc = 0;
  (this->image).p16.alloc.memoryResource = (param_1->image).p16.alloc.memoryResource;
  (this->image).p16.nStored = 0;
  (this->image).p16.ptr = (Half *)0x0;
  (this->image).p16.nAlloc = 0;
  sVar2 = (param_1->image).p16.nStored;
  (this->image).p16.nAlloc = (param_1->image).p16.nAlloc;
  (this->image).p16.nStored = sVar2;
  (this->image).p16.ptr = (param_1->image).p16.ptr;
  (param_1->image).p16.nStored = 0;
  (param_1->image).p16.ptr = (Half *)0x0;
  (param_1->image).p16.nAlloc = 0;
  (this->image).p32.alloc.memoryResource = (param_1->image).p32.alloc.memoryResource;
  (this->image).p32.nStored = 0;
  (this->image).p32.ptr = (float *)0x0;
  (this->image).p32.nAlloc = 0;
  sVar2 = (param_1->image).p32.nStored;
  (this->image).p32.nAlloc = (param_1->image).p32.nAlloc;
  (this->image).p32.nStored = sVar2;
  (this->image).p32.ptr = (param_1->image).p32.ptr;
  (param_1->image).p32.nStored = 0;
  (param_1->image).p32.ptr = (float *)0x0;
  (param_1->image).p32.nAlloc = 0;
  bVar1 = (param_1->metadata).renderTimeSeconds.set;
  (this->metadata).renderTimeSeconds.set = bVar1;
  if (bVar1 == true) {
    (this->metadata).renderTimeSeconds.optionalValue =
         (param_1->metadata).renderTimeSeconds.optionalValue;
    (param_1->metadata).renderTimeSeconds.set = false;
  }
  bVar1 = (param_1->metadata).cameraFromWorld.set;
  (this->metadata).cameraFromWorld.set = bVar1;
  if (bVar1 == true) {
    uVar4 = *(undefined8 *)((long)&(param_1->metadata).cameraFromWorld.optionalValue + 8);
    uVar5 = *(undefined8 *)((long)&(param_1->metadata).cameraFromWorld.optionalValue + 0x10);
    uVar6 = *(undefined8 *)((long)&(param_1->metadata).cameraFromWorld.optionalValue + 0x18);
    uVar7 = *(undefined8 *)((long)&(param_1->metadata).cameraFromWorld.optionalValue + 0x20);
    uVar8 = *(undefined8 *)((long)&(param_1->metadata).cameraFromWorld.optionalValue + 0x28);
    uVar9 = *(undefined8 *)((long)&(param_1->metadata).cameraFromWorld.optionalValue + 0x30);
    uVar10 = *(undefined8 *)((long)&(param_1->metadata).cameraFromWorld.optionalValue + 0x38);
    *(undefined8 *)&(this->metadata).cameraFromWorld.optionalValue =
         *(undefined8 *)&(param_1->metadata).cameraFromWorld.optionalValue;
    *(undefined8 *)((long)&(this->metadata).cameraFromWorld.optionalValue + 8) = uVar4;
    *(undefined8 *)((long)&(this->metadata).cameraFromWorld.optionalValue + 0x10) = uVar5;
    *(undefined8 *)((long)&(this->metadata).cameraFromWorld.optionalValue + 0x18) = uVar6;
    *(undefined8 *)((long)&(this->metadata).cameraFromWorld.optionalValue + 0x20) = uVar7;
    *(undefined8 *)((long)&(this->metadata).cameraFromWorld.optionalValue + 0x28) = uVar8;
    *(undefined8 *)((long)&(this->metadata).cameraFromWorld.optionalValue + 0x30) = uVar9;
    *(undefined8 *)((long)&(this->metadata).cameraFromWorld.optionalValue + 0x38) = uVar10;
    if ((param_1->metadata).cameraFromWorld.set == true) {
      (param_1->metadata).cameraFromWorld.set = false;
    }
  }
  bVar1 = (param_1->metadata).NDCFromWorld.set;
  (this->metadata).NDCFromWorld.set = bVar1;
  if (bVar1 == true) {
    uVar4 = *(undefined8 *)((long)&(param_1->metadata).NDCFromWorld.optionalValue + 8);
    uVar5 = *(undefined8 *)((long)&(param_1->metadata).NDCFromWorld.optionalValue + 0x10);
    uVar6 = *(undefined8 *)((long)&(param_1->metadata).NDCFromWorld.optionalValue + 0x18);
    uVar7 = *(undefined8 *)((long)&(param_1->metadata).NDCFromWorld.optionalValue + 0x20);
    uVar8 = *(undefined8 *)((long)&(param_1->metadata).NDCFromWorld.optionalValue + 0x28);
    uVar9 = *(undefined8 *)((long)&(param_1->metadata).NDCFromWorld.optionalValue + 0x30);
    uVar10 = *(undefined8 *)((long)&(param_1->metadata).NDCFromWorld.optionalValue + 0x38);
    *(undefined8 *)&(this->metadata).NDCFromWorld.optionalValue =
         *(undefined8 *)&(param_1->metadata).NDCFromWorld.optionalValue;
    *(undefined8 *)((long)&(this->metadata).NDCFromWorld.optionalValue + 8) = uVar4;
    *(undefined8 *)((long)&(this->metadata).NDCFromWorld.optionalValue + 0x10) = uVar5;
    *(undefined8 *)((long)&(this->metadata).NDCFromWorld.optionalValue + 0x18) = uVar6;
    *(undefined8 *)((long)&(this->metadata).NDCFromWorld.optionalValue + 0x20) = uVar7;
    *(undefined8 *)((long)&(this->metadata).NDCFromWorld.optionalValue + 0x28) = uVar8;
    *(undefined8 *)((long)&(this->metadata).NDCFromWorld.optionalValue + 0x30) = uVar9;
    *(undefined8 *)((long)&(this->metadata).NDCFromWorld.optionalValue + 0x38) = uVar10;
    if ((param_1->metadata).NDCFromWorld.set == true) {
      (param_1->metadata).NDCFromWorld.set = false;
    }
  }
  bVar1 = (param_1->metadata).pixelBounds.set;
  (this->metadata).pixelBounds.set = bVar1;
  if (bVar1 == true) {
    uVar4 = *(undefined8 *)((long)&(param_1->metadata).pixelBounds.optionalValue + 8);
    *(undefined8 *)&(this->metadata).pixelBounds.optionalValue =
         *(undefined8 *)&(param_1->metadata).pixelBounds.optionalValue;
    *(undefined8 *)((long)&(this->metadata).pixelBounds.optionalValue + 8) = uVar4;
    if ((param_1->metadata).pixelBounds.set == true) {
      (param_1->metadata).pixelBounds.set = false;
    }
  }
  bVar1 = (param_1->metadata).fullResolution.set;
  (this->metadata).fullResolution.set = bVar1;
  if ((bVar1 == true) &&
     ((this->metadata).fullResolution.optionalValue =
           (param_1->metadata).fullResolution.optionalValue,
     (param_1->metadata).fullResolution.set == true)) {
    (param_1->metadata).fullResolution.set = false;
  }
  bVar1 = (param_1->metadata).samplesPerPixel.set;
  (this->metadata).samplesPerPixel.set = bVar1;
  if (bVar1 == true) {
    (this->metadata).samplesPerPixel.optionalValue =
         (param_1->metadata).samplesPerPixel.optionalValue;
    (param_1->metadata).samplesPerPixel.set = false;
  }
  bVar1 = (param_1->metadata).MSE.set;
  (this->metadata).MSE.set = bVar1;
  if (bVar1 == true) {
    (this->metadata).MSE.optionalValue = (param_1->metadata).MSE.optionalValue;
    (param_1->metadata).MSE.set = false;
  }
  bVar1 = (param_1->metadata).colorSpace.set;
  (this->metadata).colorSpace.set = bVar1;
  if (bVar1 == true) {
    (this->metadata).colorSpace.optionalValue = (param_1->metadata).colorSpace.optionalValue;
    (param_1->metadata).colorSpace.set = false;
  }
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header,
             &(param_1->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header);
  return;
}

Assistant:

Image(Allocator alloc = {})
        : p8(alloc),
          p16(alloc),
          p32(alloc),
          format(PixelFormat::U256),
          resolution(0, 0) {}